

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O3

void vsencoding::__vseblocks_unpack2(uint32_t *out,uint32_t *in,uint32_t bs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  uint uVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  
  if (0x1f < bs + 0x1f) {
    auVar2 = vpmovsxbd_avx2(ZEXT816(0xe10121416181a1c));
    auVar1 = vpmovsxbd_avx(ZEXT416(0x6080a0c));
    auVar16._8_8_ = 0x200000004;
    auVar16._0_8_ = 0x200000004;
    auVar8 = vpmovsxbd_avx512f(_DAT_0018d910);
    auVar9 = vpmovsxbd_avx512f(_DAT_0018d920);
    auVar10 = vpmovsxbd_avx512f(_DAT_0018d8f0);
    auVar11 = vpmovsxbd_avx512f(_DAT_0018d930);
    auVar12 = vpbroadcastd_avx512f(ZEXT416(3));
    uVar6 = 0;
    do {
      auVar7 = vpbroadcastd_avx512vl();
      uVar6 = uVar6 + 1;
      auVar5 = vpsrlvd_avx2(auVar7,auVar2);
      auVar3 = vpsrlvd_avx2(auVar7._0_16_,auVar1);
      auVar4 = vpsrlvd_avx2(auVar7._0_16_,auVar16);
      auVar13 = vpermt2d_avx512f(ZEXT3264(auVar5),auVar8,ZEXT3264(auVar7));
      auVar13 = vpermt2d_avx512f(auVar13,auVar9,ZEXT1664(auVar3));
      auVar13 = vpermt2d_avx512f(auVar13,auVar10,ZEXT1664(auVar4));
      auVar13 = vpandd_avx512f(auVar13,auVar12);
      auVar14 = vpsrlvd_avx512f(ZEXT3264(auVar7),auVar11);
      auVar14._4_4_ = auVar13._4_4_;
      auVar14._8_4_ = auVar13._8_4_;
      auVar14._12_4_ = auVar13._12_4_;
      auVar14._16_4_ = auVar13._16_4_;
      auVar14._20_4_ = auVar13._20_4_;
      auVar14._24_4_ = auVar13._24_4_;
      auVar14._28_4_ = auVar13._28_4_;
      auVar14._32_4_ = auVar13._32_4_;
      auVar14._36_4_ = auVar13._36_4_;
      auVar14._40_4_ = auVar13._40_4_;
      auVar14._44_4_ = auVar13._44_4_;
      auVar14._48_4_ = auVar13._48_4_;
      auVar14._52_4_ = auVar13._52_4_;
      auVar14._56_4_ = auVar13._56_4_;
      auVar14._60_4_ = auVar13._60_4_;
      auVar7 = vpbroadcastd_avx512vl();
      auVar13 = vmovdqu64_avx512f(auVar14);
      *(undefined1 (*) [64])out = auVar13;
      auVar5 = vpsrlvd_avx2(auVar7,auVar2);
      auVar3 = vpsrlvd_avx2(auVar7._0_16_,auVar1);
      auVar4 = vpsrlvd_avx2(auVar7._0_16_,auVar16);
      auVar13 = vpermt2d_avx512f(ZEXT3264(auVar5),auVar8,ZEXT3264(auVar7));
      auVar13 = vpermt2d_avx512f(auVar13,auVar9,ZEXT1664(auVar3));
      auVar13 = vpermt2d_avx512f(auVar13,auVar10,ZEXT1664(auVar4));
      auVar13 = vpandd_avx512f(auVar13,auVar12);
      auVar14 = vpsrlvd_avx512f(ZEXT3264(auVar7),auVar11);
      auVar15._0_4_ = auVar14._0_4_;
      auVar15._4_4_ = auVar13._4_4_;
      auVar15._8_4_ = auVar13._8_4_;
      auVar15._12_4_ = auVar13._12_4_;
      auVar15._16_4_ = auVar13._16_4_;
      auVar15._20_4_ = auVar13._20_4_;
      auVar15._24_4_ = auVar13._24_4_;
      auVar15._28_4_ = auVar13._28_4_;
      auVar15._32_4_ = auVar13._32_4_;
      auVar15._36_4_ = auVar13._36_4_;
      auVar15._40_4_ = auVar13._40_4_;
      auVar15._44_4_ = auVar13._44_4_;
      auVar15._48_4_ = auVar13._48_4_;
      auVar15._52_4_ = auVar13._52_4_;
      auVar15._56_4_ = auVar13._56_4_;
      auVar15._60_4_ = auVar13._60_4_;
      auVar13 = vmovdqu64_avx512f(auVar15);
      *(undefined1 (*) [64])((long)out + 0x40) = auVar13;
      out = (uint32_t *)((long)out + 0x80);
    } while (bs + 0x1f >> 5 != uVar6);
  }
  return;
}

Assistant:

void __vseblocks_unpack2(uint32_t *__restrict__ out,
                         const uint32_t *__restrict__ in, uint32_t bs) {
  // for (uint32_t i = 0; i < bs; i += 32, out += 32, in += 2) {
  for (bs = (bs + 31U) / 32U; bs > 0; out += 32, in += 2, --bs) {
    out[0] = in[0] >> 30;
    out[1] = (in[0] >> 28) & 0x03;
    out[2] = (in[0] >> 26) & 0x03;
    out[3] = (in[0] >> 24) & 0x03;
    out[4] = (in[0] >> 22) & 0x03;
    out[5] = (in[0] >> 20) & 0x03;
    out[6] = (in[0] >> 18) & 0x03;
    out[7] = (in[0] >> 16) & 0x03;
    out[8] = (in[0] >> 14) & 0x03;
    out[9] = (in[0] >> 12) & 0x03;
    out[10] = (in[0] >> 10) & 0x03;
    out[11] = (in[0] >> 8) & 0x03;
    out[12] = (in[0] >> 6) & 0x03;
    out[13] = (in[0] >> 4) & 0x03;
    out[14] = (in[0] >> 2) & 0x03;
    out[15] = in[0] & 0x03;
    out[16] = in[1] >> 30;
    out[17] = (in[1] >> 28) & 0x03;
    out[18] = (in[1] >> 26) & 0x03;
    out[19] = (in[1] >> 24) & 0x03;
    out[20] = (in[1] >> 22) & 0x03;
    out[21] = (in[1] >> 20) & 0x03;
    out[22] = (in[1] >> 18) & 0x03;
    out[23] = (in[1] >> 16) & 0x03;
    out[24] = (in[1] >> 14) & 0x03;
    out[25] = (in[1] >> 12) & 0x03;
    out[26] = (in[1] >> 10) & 0x03;
    out[27] = (in[1] >> 8) & 0x03;
    out[28] = (in[1] >> 6) & 0x03;
    out[29] = (in[1] >> 4) & 0x03;
    out[30] = (in[1] >> 2) & 0x03;
    out[31] = in[1] & 0x03;
  }
}